

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O3

void rw::expandPal4(uint8 *dst,uint32 dststride,uint8 *src,uint32 srcstride,int32 w,int32 h)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  if (0 < h) {
    uVar3 = 1;
    uVar4 = 0;
    iVar1 = 0;
    do {
      uVar5 = (ulong)(uint)(w / 2);
      uVar2 = uVar4;
      uVar6 = uVar3;
      if (1 < w) {
        do {
          dst[uVar6 - 1] = src[uVar2] & 0xf;
          dst[uVar6] = src[uVar2] >> 4;
          uVar5 = uVar5 - 1;
          uVar2 = uVar2 + 1;
          uVar6 = uVar6 + 2;
        } while (uVar5 != 0);
      }
      iVar1 = iVar1 + 1;
      uVar3 = uVar3 + dststride;
      uVar4 = uVar4 + srcstride;
    } while (iVar1 != h);
  }
  return;
}

Assistant:

void
expandPal4(uint8 *dst, uint32 dststride, uint8 *src, uint32 srcstride, int32 w, int32 h)
{
	int32 x, y;
	for(y = 0; y < h; y++)
		for(x = 0; x < w/2; x++){
			dst[y*dststride + x*2 + 0] = src[y*srcstride + x] & 0xF;
			dst[y*dststride + x*2 + 1] = src[y*srcstride + x] >> 4;
		}
}